

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O1

size_t __thiscall cs222::Instruction::getLength(Instruction *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  Format FVar5;
  int iVar6;
  Type TVar7;
  long *plVar8;
  int *piVar9;
  undefined8 uVar10;
  long *plVar11;
  int *piVar12;
  string op;
  undefined1 local_78 [32];
  string local_58;
  _Alloc_hider local_38;
  
  paVar1 = &local_58.field_2;
  pcVar2 = (this->operation)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (this->operation)._M_string_length);
  if (*local_58._M_dataplus._M_p == '+') {
    std::__cxx11::string::substr((ulong)local_78,(ulong)&local_58);
    std::__cxx11::string::operator=((string *)&local_58,(string *)local_78);
    if ((Instruction *)local_78._0_8_ != (Instruction *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
  }
  bVar4 = isOperation(&local_58);
  if (bVar4) {
    FVar5 = getFormat(this);
    plVar8 = *(long **)(Length + ((ulong)FVar5 % _DAT_00145c70) * 8);
    for (plVar11 = (long *)*plVar8; FVar5 != *(Format *)(plVar11 + 1); plVar11 = (long *)*plVar11) {
      plVar8 = plVar11;
    }
    piVar12 = *(int **)(*plVar8 + 0x10);
    goto LAB_00122dc0;
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar6 == 0) {
    piVar12 = (int *)0x3;
    goto LAB_00122dc0;
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar6 == 0) {
    Operand::getValue_abi_cxx11_((string *)local_78,&(this->operands).first);
    uVar10 = local_78._0_8_;
    piVar12 = __errno_location();
    iVar6 = *piVar12;
    *piVar12 = 0;
    this = (Instruction *)strtoul((char *)uVar10,&local_38._M_p,10);
    if (local_38._M_p == (pointer)uVar10) {
      std::__throw_invalid_argument("stoul");
      goto LAB_00122df5;
    }
    if (*piVar12 == 0) {
LAB_00122d28:
      *piVar12 = iVar6;
    }
    else if (*piVar12 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_00122ccb;
    }
    if ((Instruction *)local_78._0_8_ != (Instruction *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    piVar12 = (int *)((long)this * 3);
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)&local_58);
      if (iVar6 == 0) {
        Operand::getValue_abi_cxx11_((string *)local_78,&(this->operands).first);
        if ((Instruction *)local_78._0_8_ != (Instruction *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
        TVar7 = Operand::getType(&(this->operands).first);
        bVar4 = TVar7 == HEX_CONSTANT;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&this->label);
        if (iVar6 != 0) {
          piVar12 = (int *)0x0;
          goto LAB_00122dc0;
        }
        sVar3 = (this->operation)._M_string_length;
        TVar7 = Operand::getType(&(this->operands).first);
        bVar4 = TVar7 == HEX_LITERAL;
        local_78._8_8_ = sVar3;
      }
      piVar12 = (int *)((ulong)local_78._8_8_ >> bVar4);
      goto LAB_00122dc0;
    }
LAB_00122ccb:
    Operand::getValue_abi_cxx11_((string *)local_78,&(this->operands).first);
    this = (Instruction *)local_78._0_8_;
    piVar9 = __errno_location();
    iVar6 = *piVar9;
    *piVar9 = 0;
    piVar12 = (int *)strtoul((char *)this,&local_38._M_p,10);
    if ((Instruction *)local_38._M_p == this) {
LAB_00122df5:
      uVar10 = std::__throw_invalid_argument("stoul");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._0_8_ + 1);
      }
      _Unwind_Resume(uVar10);
    }
    if (*piVar9 == 0) {
      *piVar9 = iVar6;
    }
    else if (*piVar9 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_00122d28;
    }
    if ((Instruction *)local_78._0_8_ != (Instruction *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
  }
LAB_00122dc0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._0_8_ + 1);
  }
  return (size_t)piVar12;
}

Assistant:

size_t Instruction::getLength() const
    {
        size_t length = 0;
        std::string op = operation;
        if (op[0] == '+')
            op = op.substr(1);

        if (isOperation(op))
        {
            length = Length.find(getFormat())->second;
        }
        else if (op == DIR_WORD)
        {
            length = 3;
        }
        else if (op == DIR_RESW)
        {
            length = 3 * std::stoul(operands.first.getValue());
        }
        else if (op == DIR_RESB)
        {
            length = std::stoul(operands.first.getValue());
        }
        else if (op == DIR_BYTE)
        {
            length = operands.first.getValue().length();
            if (operands.first.getType() == Operand::HEX_CONSTANT)
            {
                length /= 2;
            }
        }
        else if (label == "*") {
            length = operation.length();
            if (operands.first.getType() == Operand::HEX_LITERAL)
            {
                length /= 2;
            }
        }

        return length;
    }